

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  _Rb_tree_header *p_Var1;
  ulong __val;
  char cVar2;
  int iVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char cVar10;
  char *pcVar11;
  Stream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Response *pRVar13;
  Headers *pHVar14;
  bool bVar15;
  bool bVar16;
  string length;
  string chunk;
  string ret;
  key_type local_168;
  Request *local_148;
  Stream *local_140;
  Headers *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Response *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Server *local_88;
  _Any_data *local_80;
  _Base_ptr local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_148 = req;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                  ,0x671,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
  }
  iVar3 = res->status;
  if (iVar3 < 400) {
    switch(iVar3) {
    case 0x12d:
      local_168._M_dataplus._M_p = "Moved Permanently";
      break;
    case 0x12e:
      local_168._M_dataplus._M_p = "Found";
      break;
    case 0x12f:
      local_168._M_dataplus._M_p = "See Other";
      break;
    case 0x130:
      local_168._M_dataplus._M_p = "Not Modified";
      break;
    default:
      if (iVar3 == 200) {
        local_168._M_dataplus._M_p = "OK";
        break;
      }
      goto LAB_00145624;
    }
  }
  else {
    if (iVar3 < 0x194) {
      if (iVar3 == 400) {
        local_168._M_dataplus._M_p = "Bad Request";
        goto LAB_0014562b;
      }
      if (iVar3 == 0x193) {
        local_168._M_dataplus._M_p = "Forbidden";
        goto LAB_0014562b;
      }
    }
    else {
      if (iVar3 == 0x194) {
        local_168._M_dataplus._M_p = "Not Found";
        goto LAB_0014562b;
      }
      if (iVar3 == 0x19f) {
        local_168._M_dataplus._M_p = "Unsupported Media Type";
        goto LAB_0014562b;
      }
    }
LAB_00145624:
    local_168._M_dataplus._M_p = "Internal Server Error";
  }
LAB_0014562b:
  local_88 = this;
  Stream::write_format<int,char_const*>(strm,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_168);
  bVar16 = true;
  local_140 = strm;
  if (!last_connection) {
    pHVar14 = &local_148->headers;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Connection","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar14->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar4._M_node == &(local_148->headers)._M_t._M_impl.super__Rb_tree_header
       ) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)(cVar4._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_50,pcVar11,(allocator *)&local_168);
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    bVar16 = iVar3 == 0;
  }
  if ((!last_connection) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar16) {
    local_168._M_dataplus._M_p = "Connection";
    local_70[0] = (long *)0x15c4cd;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,(char **)&local_168,(char **)local_70);
  }
  if (last_connection) {
    bVar16 = false;
  }
  else {
    pHVar14 = &local_148->headers;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Connection","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar14->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar4._M_node == &(local_148->headers)._M_t._M_impl.super__Rb_tree_header
       ) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)(cVar4._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_70,pcVar11,(allocator *)&local_168);
    iVar3 = std::__cxx11::string::compare((char *)local_70);
    bVar16 = iVar3 == 0;
  }
  if ((!last_connection) && (local_70[0] != local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (bVar16) {
    local_168._M_dataplus._M_p = "Connection";
    local_130._M_dataplus._M_p = "Keep-Alive";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,(char **)&local_168,(char **)&local_130);
  }
  pHVar14 = &res->headers;
  if ((res->body)._M_string_length == 0) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Content-Length","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar14->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_140;
    if ((_Rb_tree_header *)cVar4._M_node == &(res->headers)._M_t._M_impl.super__Rb_tree_header) {
      if ((res->streamcb).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_168._M_dataplus._M_p = "Content-Length";
        local_130._M_dataplus._M_p = "0";
      }
      else {
        local_168._M_dataplus._M_p = "Transfer-Encoding";
        local_130._M_dataplus._M_p = "chunked";
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar14,(char **)&local_168,(char **)&local_130);
    }
  }
  else {
    paVar12 = &local_168.field_2;
    local_168._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Content-Type","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar14->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar12) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar4._M_node == &(res->headers)._M_t._M_impl.super__Rb_tree_header) {
      local_168._M_dataplus._M_p = "Content-Type";
      local_130._M_dataplus._M_p = "text/plain";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar14,(char **)&local_168,(char **)&local_130);
    }
    __val = (res->body)._M_string_length;
    cVar10 = '\x01';
    if (9 < __val) {
      uVar7 = __val;
      cVar2 = '\x04';
      do {
        cVar10 = cVar2;
        if (uVar7 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_001459bb;
        }
        if (uVar7 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_001459bb;
        }
        if (uVar7 < 10000) goto LAB_001459bb;
        bVar16 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar2 = cVar10 + '\x04';
      } while (bVar16);
      cVar10 = cVar10 + '\x01';
    }
LAB_001459bb:
    local_168._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct((ulong)&local_168,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_168._M_dataplus._M_p,(uint)local_168._M_string_length,__val);
    local_130._M_dataplus._M_p = "Content-Length";
    local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_168._M_dataplus._M_p;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar14,(char **)&local_130,(char **)&local_a8);
    this_00 = local_140;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar12) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      this_00 = local_140;
    }
  }
  p_Var5 = (res->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  local_138 = pHVar14;
  local_f0 = res;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      local_168._M_dataplus._M_p = *(pointer *)(p_Var5 + 1);
      local_130._M_dataplus._M_p = *(pointer *)(p_Var5 + 2);
      Stream::write_format<char_const*,char_const*>
                (this_00,"%s: %s\r\n",(char **)&local_168,(char **)&local_130);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  (*this_00->_vptr_Stream[4])(this_00,"\r\n");
  iVar3 = std::__cxx11::string::compare((char *)&local_148->method);
  pRVar13 = local_f0;
  if (iVar3 != 0) {
    if ((local_f0->body)._M_string_length == 0) {
      if ((local_f0->streamcb).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Content-Length","");
        local_78 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&local_138->_M_t,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        local_80 = (_Any_data *)&pRVar13->streamcb;
        bVar16 = true;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        do {
          if (!bVar16) break;
          local_168._M_dataplus._M_p = (pointer)paVar12;
          if ((pRVar13->streamcb).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(pRVar13->streamcb)._M_invoker)(&local_130,local_80,(unsigned_long *)&local_168);
          local_138 = (Headers *)local_130._M_string_length;
          bVar16 = (Headers *)local_130._M_string_length != (Headers *)0x0;
          if ((_Rb_tree_header *)local_78 == p_Var1) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            local_110._M_string_length = 0;
            local_110.field_2._M_local_buf[0] = '\0';
            pHVar14 = (Headers *)local_130._M_string_length;
            do {
              std::operator+(&local_168,"0123456789abcdef"[(uint)pHVar14 & 0xf],&local_110);
              std::__cxx11::string::operator=((string *)&local_110,(string *)&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              bVar15 = (Headers *)0xf < pHVar14;
              pHVar14 = (Headers *)((ulong)pHVar14 >> 4);
            } while (bVar15);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
            local_e8 = &local_d8;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_d8 = *plVar8;
              lStack_d0 = plVar6[3];
            }
            else {
              local_d8 = *plVar8;
              local_e8 = (long *)*plVar6;
            }
            local_e0 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_e8,(ulong)local_130._M_dataplus._M_p);
            local_c8 = &local_b8;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_b8 = *plVar8;
              lStack_b0 = plVar6[3];
            }
            else {
              local_b8 = *plVar8;
              local_c8 = (long *)*plVar6;
            }
            local_c0 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar9) {
              local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_98._8_8_ = plVar6[3];
              local_a8 = &local_98;
            }
            else {
              local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar6;
            }
            local_a0 = plVar6[1];
            *plVar6 = (long)paVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_130,(string *)&local_a8);
            if (local_a8 != &local_98) {
              operator_delete(local_a8,local_98._M_allocated_capacity + 1);
            }
            if (local_c8 != &local_b8) {
              operator_delete(local_c8,local_b8 + 1);
            }
            if (local_e8 != &local_d8) {
              operator_delete(local_e8,local_d8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                       local_110.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar3 = (*local_140->_vptr_Stream[3])
                            (local_140,local_130._M_dataplus._M_p,local_130._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar12->_M_local_buf + (long)local_138);
          pRVar13 = local_f0;
        } while (-1 < iVar3);
      }
    }
    else {
      (*local_140->_vptr_Stream[3])(local_140,(local_f0->body)._M_dataplus._M_p);
    }
  }
  if ((local_88->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_88->logger_)._M_invoker)((_Any_data *)&local_88->logger_,local_148,pRVar13);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!last_connection &&
        req.get_header_value("Connection") == "Keep-Alive") {
        res.set_header("Connection", "Keep-Alive");
    }

    if (res.body.empty()) {
        if (!res.has_header("Content-Length")) {
            if (res.streamcb) {
                // Streamed response
                res.set_header("Transfer-Encoding", "chunked");
            } else {
                res.set_header("Content-Length", "0");
            }
        }
    } else {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (req.method != "HEAD") {
        if (!res.body.empty()) {
            strm.write(res.body.c_str(), res.body.size());
        } else if (res.streamcb) {
            bool chunked_response = !res.has_header("Content-Length");
            uint64_t offset = 0;
            bool data_available = true;
            while (data_available) {
                std::string chunk = res.streamcb(offset);
                offset += chunk.size();
                data_available = !chunk.empty();
                // Emit chunked response header and footer for each chunk
                if (chunked_response)
                    chunk = detail::from_i_to_hex(chunk.size()) + "\r\n" + chunk + "\r\n";
                if (strm.write(chunk.c_str(), chunk.size()) < 0)
                    break;  // Stop on error
            }
        }
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}